

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall
soul::StructuralParser::parseType(StructuralParser *this,ParseTypeContext parseContext)

{
  pool_ptr<soul::AST::Expression> type;
  undefined1 local_50 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  TokenType local_28;
  
  tryParsingType((StructuralParser *)local_50,(ParseTypeContext)this);
  if ((Expression *)local_50._0_8_ == (Expression *)0x0) {
    CompileMessageHelpers::createMessage<>
              ((CompileMessage *)(local_50 + 8),syntax,error,"Expected a type");
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,(CompileMessage *)(local_50 + 8));
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_28.text);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._8_8_ != &local_38) {
      operator_delete((void *)local_50._8_8_,(ulong)(local_38._M_allocated_capacity + 1));
    }
    if ((Expression *)local_50._0_8_ == (Expression *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
  }
  return (Expression *)local_50._0_8_;
}

Assistant:

AST::Expression& parseType (ParseTypeContext parseContext)
    {
        auto type = tryParsingType (parseContext);

        if (type == nullptr)
            throwError (Errors::expectedType());

        return *type;
    }